

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_a0110::check_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  bson_encode_options *in_stack_00000010;
  exception *e;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000020;
  vector<unsigned_char,_std::allocator<unsigned_char>_> u;
  json j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000128;
  bson_decode_options *in_stack_00000130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000138;
  bson_decode_options *in_stack_ffffffffffffff70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  
  test_equal((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_00000130,
             in_stack_00000128);
  jsoncons::bson::bson_decode_options::bson_decode_options(in_stack_ffffffffffffff70);
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_00000138,in_stack_00000130);
  jsoncons::bson::bson_decode_options::~bson_decode_options(in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x22d1bf);
  jsoncons::bson::bson_encode_options::bson_encode_options
            ((bson_encode_options *)in_stack_ffffffffffffff70);
  jsoncons::bson::
  encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_00000020,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)e,
             in_stack_00000010);
  jsoncons::bson::bson_encode_options::~bson_encode_options
            ((bson_encode_options *)in_stack_ffffffffffffff70);
  test_equal((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_00000130,
             in_stack_00000128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff80);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x22d213);
  return;
}

Assistant:

void check_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        test_equal(v, expected);
        JSONCONS_TRY
        {
            json j = bson::decode_bson<json>(v);
            std::vector<uint8_t> u;
            bson::encode_bson(j, u);
            test_equal(v,u);
        }